

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thief.c
# Opt level: O1

void do_shadow_cloak(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  char *txt;
  AFFECT_DATA af;
  AFFECT_DATA local_90;
  
  iVar2 = get_skill(ch,(int)gsn_shadow_cloak);
  if (iVar2 == 0) {
    txt = "Huh?\n\r";
  }
  else {
    bVar1 = is_affected(ch,(int)gsn_shadow_cloak);
    if (bVar1) {
      txt = "You are already cloaked!\n\r";
    }
    else {
      if (skill_table[gsn_shadow_cloak].min_mana <= ch->mana) {
        iVar3 = number_percent();
        if (iVar3 < iVar2) {
          act("You sharpen your mind and attempt to shield yourself from scrying magic.",ch,
              (void *)0x0,(void *)0x0,3);
          init_affect(&local_90);
          local_90.where = 0;
          local_90.type = gsn_shadow_cloak;
          local_90.level = ch->level;
          local_90.duration =
               (short)((uint)(int)(short)(local_90.level - (local_90.level >> 0xf)) >> 1);
          local_90.aftype = 1;
          affect_to_char(ch,&local_90);
        }
        else {
          act("You sharpen your mind and attempt to shield yourself from scrying magic, but you fail."
              ,ch,(void *)0x0,(void *)0x0,3);
        }
        check_improve(ch,(int)gsn_shadow_cloak,iVar3 < iVar2,1);
        WAIT_STATE(ch,0x18);
        return;
      }
      txt = "You do not have the mana.\n\r";
    }
  }
  send_to_char(txt,ch);
  return;
}

Assistant:

void do_shadow_cloak(CHAR_DATA *ch, char *argument)
{
	AFFECT_DATA af;
	int skill, cost;

	skill = get_skill(ch, gsn_shadow_cloak);

	if (skill == 0)
	{
		send_to_char("Huh?\n\r", ch);
		return;
	}

	if (is_affected(ch, gsn_shadow_cloak))
	{
		send_to_char("You are already cloaked!\n\r", ch);
		return;
	}

	cost = skill_table[gsn_shadow_cloak].min_mana;

	if ((ch->mana - cost) < 0)
	{
		send_to_char("You do not have the mana.\n\r", ch);
		return;
	}

	if (number_percent() < skill)
	{
		act("You sharpen your mind and attempt to shield yourself from scrying magic.", ch, 0, 0, TO_CHAR);

		init_affect(&af);
		af.where = TO_AFFECTS;
		af.type = gsn_shadow_cloak;
		af.level = ch->level;
		af.duration = ch->level / 2;
		af.aftype = AFT_SKILL;
		affect_to_char(ch, &af);
		check_improve(ch, gsn_shadow_cloak, true, 1);
	}
	else
	{
		act("You sharpen your mind and attempt to shield yourself from scrying magic, but you fail.", ch, 0, 0, TO_CHAR);
		check_improve(ch, gsn_shadow_cloak, false, 1);
	}

	WAIT_STATE(ch, PULSE_VIOLENCE * 2);
}